

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetInstallNameDirForInstallTree_abi_cxx11_(string *__return_storage_ptr__,cmTarget *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  byte local_122;
  allocator local_cc;
  byte local_cb;
  byte local_ca;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  char *local_58;
  char *install_name_dir;
  allocator local_39;
  string local_38;
  cmTarget *local_18;
  cmTarget *this_local;
  string *dir;
  
  pcVar1 = this->Makefile;
  local_18 = this;
  this_local = (cmTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_39);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar2) {
    install_name_dir._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"INSTALL_NAME_DIR",&local_79);
    pcVar3 = GetProperty(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pcVar1 = this->Makefile;
    local_58 = pcVar3;
    std::allocator<char>::allocator();
    local_ca = 0;
    local_cb = 0;
    std::__cxx11::string::string((string *)&local_a0,"CMAKE_SKIP_RPATH",&local_a1);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_a0);
    local_122 = 0;
    if (!bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_ca = 1;
      std::__cxx11::string::string((string *)&local_c8,"CMAKE_SKIP_INSTALL_RPATH",&local_c9);
      local_cb = 1;
      bVar2 = cmMakefile::IsOn(pcVar1,&local_c8);
      local_122 = bVar2 ^ 0xff;
    }
    if ((local_cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if ((local_ca & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    if ((((local_122 & 1) != 0) && (local_58 != (char *)0x0)) && (*local_58 != '\0')) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    }
    if ((local_58 == (char *)0x0) && (bVar2 = MacOSXRpathInstallNameDirDefault(this), bVar2)) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"@rpath/");
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_cc);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetInstallNameDirForInstallTree() const
{
  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME"))
    {
    std::string dir;
    const char* install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if(!this->Makefile->IsOn("CMAKE_SKIP_RPATH") &&
       !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH"))
      {
      if(install_name_dir && *install_name_dir)
        {
        dir = install_name_dir;
        dir += "/";
        }
      }
    if(!install_name_dir)
      {
      if(this->MacOSXRpathInstallNameDirDefault())
        {
        dir = "@rpath/";
        }
      }
    return dir;
    }
  else
    {
    return "";
    }
}